

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.cc
# Opt level: O0

void __thiscall avro::NodeEnum::printJson(NodeEnum *this,ostream *os,int depth)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  int in_EDX;
  Name *in_RSI;
  int i;
  int names;
  size_t in_stack_ffffffffffffff88;
  MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff90;
  ostream *in_stack_ffffffffffffffa8;
  Name *pNVar5;
  indent x;
  Name *n;
  ostream *in_stack_ffffffffffffffc0;
  indent local_30;
  indent local_2c;
  indent in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar6;
  undefined4 in_stack_ffffffffffffffe0;
  indent in_stack_ffffffffffffffe4;
  indent local_18;
  int local_14;
  Name *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::operator<<((ostream *)in_RSI,"{\n");
  local_14 = local_14 + 1;
  pNVar5 = local_10;
  indent::indent(&local_18,local_14);
  poVar2 = avro::operator<<(in_stack_ffffffffffffffa8,(indent)(int)((ulong)pNVar5 >> 0x20));
  std::operator<<(poVar2,"\"type\": \"enum\",\n");
  n = local_10;
  concepts::SingleAttribute<avro::Name>::get
            ((SingleAttribute<avro::Name> *)
             CONCAT44(in_stack_ffffffffffffffe4.d,in_stack_ffffffffffffffe0),
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8.d));
  printName(in_stack_ffffffffffffffc0,n,(int)((ulong)pNVar5 >> 0x20));
  indent::indent((indent *)&stack0xffffffffffffffe4,local_14);
  poVar2 = avro::operator<<(in_stack_ffffffffffffffa8,(indent)(int)((ulong)pNVar5 >> 0x20));
  std::operator<<(poVar2,"\"symbols\": [\n");
  sVar3 = concepts::
          MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1f58d9);
  iVar1 = (int)sVar3;
  local_14 = local_14 + 1;
  for (iVar6 = 0; x.d = (int)((ulong)pNVar5 >> 0x20), iVar6 < iVar1; iVar6 = iVar6 + 1) {
    if (0 < iVar6) {
      std::operator<<((ostream *)local_10,",\n");
    }
    indent::indent((indent *)&stack0xffffffffffffffd8,local_14);
    poVar2 = avro::operator<<(in_stack_ffffffffffffffa8,(indent)(int)((ulong)pNVar5 >> 0x20));
    in_stack_ffffffffffffffa8 = std::operator<<(poVar2,'\"');
    pbVar4 = concepts::
             MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::get(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    poVar2 = std::operator<<(in_stack_ffffffffffffffa8,(string *)pbVar4);
    std::operator<<(poVar2,'\"');
  }
  std::operator<<((ostream *)local_10,'\n');
  local_14 = local_14 + -1;
  indent::indent(&local_2c,local_14);
  poVar2 = avro::operator<<(in_stack_ffffffffffffffa8,x);
  std::operator<<(poVar2,"]\n");
  local_14 = local_14 + -1;
  indent::indent(&local_30,local_14);
  poVar2 = avro::operator<<(in_stack_ffffffffffffffa8,x);
  std::operator<<(poVar2,'}');
  return;
}

Assistant:

void 
NodeEnum::printJson(std::ostream &os, int depth) const
{
    os << "{\n";
    os << indent(++depth) << "\"type\": \"enum\",\n";
    printName(os, nameAttribute_.get(), depth);
    os << indent(depth) << "\"symbols\": [\n";

    int names = leafNameAttributes_.size();
    ++depth;
    for(int i = 0; i < names; ++i) {
        if(i > 0) {
            os << ",\n";
        }
        os << indent(depth) << '\"' << leafNameAttributes_.get(i) << '\"';
    }
    os << '\n';
    os << indent(--depth) << "]\n";
    os << indent(--depth) << '}';
}